

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemInterface::handleMouseEvent<QWindowSystemInterface::SynchronousDelivery>
               (QWindow *window,ulong timestamp,QPointingDevice *device,QPointF *local,
               QPointF *global,MouseButtons state,MouseButton button,Type type,
               KeyboardModifiers mods,MouseEventSource source)

{
  long lVar1;
  QPointF args_2;
  bool bVar2;
  undefined8 in_RDX;
  QPointF *in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  QPointF QVar3;
  QPointF QVar4;
  int in_stack_00000010;
  undefined4 in_stack_00000018;
  bool isNonClientArea;
  QPointF globalPos;
  QPointF localPos;
  Type in_stack_ffffffffffffff60;
  MouseButton in_stack_ffffffffffffff64;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  uint3 in_stack_ffffffffffffff74;
  uint uVar5;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_ffffffffffffffa0;
  QFlagsStorage<Qt::MouseButton> in_stack_ffffffffffffffa4;
  qreal local_30;
  qreal local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)in_stack_ffffffffffffff74;
  if (1 < in_stack_00000010 - 2U) {
    if (in_stack_00000010 == 4) {
LAB_00444faf:
      bVar2 = false;
      goto LAB_00445104;
    }
    if (in_stack_00000010 != 5) {
      if (in_stack_00000010 - 0xadU < 3) {
        uVar5 = CONCAT13(1,in_stack_ffffffffffffff74);
      }
      else if (in_stack_00000010 == 0xb0) goto LAB_00444faf;
    }
  }
  QVar3 = QHighDpi::fromNativeLocalPosition<QPointF,QWindow>
                    ((QPointF *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                     (QWindow *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  QVar4 = QHighDpi::fromNativeGlobalPosition<QPointF,QWindow>
                    (in_R8,(QWindow *)CONCAT44(uVar5,in_stack_00000010));
  local_30 = QVar4.xp;
  local_28 = QVar4.yp;
  args_2.yp = QVar3.xp;
  args_2.xp = local_28;
  QVar4.xp._4_4_ = in_R9D;
  QVar4.xp._0_4_ = in_stack_00000018;
  QVar4.yp = local_30;
  bVar2 = handleWindowSystemEvent<QWindowSystemInterfacePrivate::MouseEvent,QWindowSystemInterface::SynchronousDelivery,QWindow*,unsigned_long,QPointF,QPointF,QFlags<Qt::MouseButton>,QFlags<Qt::KeyboardModifier>,Qt::MouseButton,QEvent::Type,Qt::MouseEventSource,bool,QPointingDevice_const*>
                    ((QWindow *)CONCAT44(uVar5,in_stack_00000010),
                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),args_2,QVar4,
                     (QFlags<Qt::MouseButton>)in_stack_ffffffffffffffa4.i,
                     (QFlags<Qt::KeyboardModifier>)in_stack_ffffffffffffffa0.i,
                     in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,QVar3.xp._0_4_,
                     SUB81((ulong)in_RDX >> 0x38,0),
                     (QPointingDevice *)CONCAT44(in_R9D,in_stack_00000018));
LAB_00445104:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

QT_DEFINE_QPA_EVENT_HANDLER(bool, handleMouseEvent, QWindow *window, ulong timestamp, const QPointingDevice *device,
                            const QPointF &local, const QPointF &global, Qt::MouseButtons state,
                            Qt::MouseButton button, QEvent::Type type, Qt::KeyboardModifiers mods,
                            Qt::MouseEventSource source)
{

    bool isNonClientArea = {};

    switch (type) {
    case QEvent::MouseButtonDblClick:
    case QEvent::NonClientAreaMouseButtonDblClick:
        Q_ASSERT_X(false, "QWindowSystemInterface::handleMouseEvent",
               "QTBUG-71263: Native double clicks are not implemented.");
        return false;
    case QEvent::MouseMove:
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
        isNonClientArea = false;
        break;
    case QEvent::NonClientAreaMouseMove:
    case QEvent::NonClientAreaMouseButtonPress:
    case QEvent::NonClientAreaMouseButtonRelease:
        isNonClientArea = true;
        break;
    default:
        Q_UNREACHABLE();
    }

    auto localPos = QHighDpi::fromNativeLocalPosition(local, window);
    auto globalPos = QHighDpi::fromNativeGlobalPosition(global, window);

    return handleWindowSystemEvent<QWindowSystemInterfacePrivate::MouseEvent, Delivery>(window,
        timestamp, localPos, globalPos, state, mods, button, type, source, isNonClientArea, device);
}